

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

vec6F * __thiscall
crnlib::dxt_hc::palettize_color(dxt_hc *this,color_quad_u8 *pixels,uint pixels_count)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  float *pfVar4;
  float in_ECX;
  long in_RDX;
  long in_RSI;
  vec<6U,_float> *in_RDI;
  float fVar5;
  float fVar6;
  vec3F result [2];
  uint i_1;
  uint size;
  uint weights [64];
  vec3F vectors [64];
  uint i;
  uint color [64];
  uint *in_stack_fffffffffffffa48;
  vec<3U,_float> *r;
  uint *in_stack_fffffffffffffa50;
  float local_5a0;
  float local_594;
  vec<3U,_float> *local_580;
  vec<6U,_float> local_558;
  vec<3U,_float> local_540 [22];
  vec<3U,_float> local_438 [64];
  vec<3U,_float> vStack_138;
  float local_12c;
  uint local_128 [67];
  float local_1c;
  long local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  for (local_12c = 0.0; (uint)local_12c < (uint)local_1c; local_12c = (float)((int)local_12c + 1)) {
    pbVar3 = color_quad<unsigned_char,_int>::operator[]
                       ((color_quad<unsigned_char,_int> *)(local_18 + (ulong)(uint)local_12c * 4),0)
    ;
    bVar1 = *pbVar3;
    pbVar3 = color_quad<unsigned_char,_int>::operator[]
                       ((color_quad<unsigned_char,_int> *)(local_18 + (ulong)(uint)local_12c * 4),1)
    ;
    bVar2 = *pbVar3;
    pbVar3 = color_quad<unsigned_char,_int>::operator[]
                       ((color_quad<unsigned_char,_int> *)(local_18 + (ulong)(uint)local_12c * 4),2)
    ;
    local_128[(uint)local_12c] = (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)*pbVar3;
  }
  std::sort<unsigned_int*>(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  local_580 = local_438;
  do {
    vec<3U,_float>::vec(local_580);
    local_580 = local_580 + 1;
  } while (local_580 != &vStack_138);
  local_540[0].m_s[1] = 0.0;
  for (local_540[0].m_s[0] = 0.0; (uint)local_540[0].m_s[0] < (uint)local_1c;
      local_540[0].m_s[0] = (float)((int)local_540[0].m_s[0] + 1)) {
    if ((local_540[0].m_s[0] == 0.0) ||
       (local_128[(uint)local_540[0].m_s[0]] != local_128[(int)local_540[0].m_s[0] - 1])) {
      if ((*(byte *)(in_RSI + 0x818) & 1) == 0) {
        local_594 = *(float *)(in_RSI + 0x234 +
                              (ulong)(local_128[(uint)local_540[0].m_s[0]] >> 0x10) * 4);
      }
      else {
        local_594 = *(float *)(in_RSI + 0x234 +
                              (ulong)(local_128[(uint)local_540[0].m_s[0]] >> 0x10) * 4) * 0.5;
      }
      pfVar4 = vec<3U,_float>::operator[](local_438 + (uint)local_540[0].m_s[1],0);
      *pfVar4 = local_594;
      fVar5 = *(float *)(in_RSI + 0x234 +
                        (ulong)(local_128[(uint)local_540[0].m_s[0]] >> 8 & 0xff) * 4);
      pfVar4 = vec<3U,_float>::operator[](local_438 + (uint)local_540[0].m_s[1],1);
      *pfVar4 = fVar5;
      if ((*(byte *)(in_RSI + 0x818) & 1) == 0) {
        local_5a0 = *(float *)(in_RSI + 0x234 +
                              (ulong)(local_128[(uint)local_540[0].m_s[0]] & 0xff) * 4);
      }
      else {
        local_5a0 = *(float *)(in_RSI + 0x234 +
                              (ulong)(local_128[(uint)local_540[0].m_s[0]] & 0xff) * 4) * 0.25;
      }
      pfVar4 = vec<3U,_float>::operator[](local_438 + (uint)local_540[0].m_s[1],2);
      *pfVar4 = local_5a0;
      local_540[0].m_s[(ulong)(uint)local_540[0].m_s[1] + 2] = 1.4013e-45;
      local_540[0].m_s[1] = (float)((int)local_540[0].m_s[1] + 1);
    }
    else {
      local_540[0].m_s[(ulong)((int)local_540[0].m_s[1] - 1) + 2] =
           (float)((int)local_540[0].m_s[(ulong)((int)local_540[0].m_s[1] - 1) + 2] + 1);
    }
  }
  pfVar4 = local_558.m_s;
  r = local_540;
  do {
    vec<3U,_float>::vec((vec<3U,_float> *)pfVar4);
    pfVar4 = pfVar4 + 3;
  } while ((vec<3U,_float> *)pfVar4 != r);
  split_vectors<crnlib::vec<3u,float>>
            ((vec<3U,_float> (*) [64])vectors._224_8_,(uint (*) [64])vectors[0x12].m_s._0_8_,
             (uint)vectors[0x11].m_s[2],(vec<3U,_float> (*) [2])vectors._200_8_);
  fVar5 = vec<3U,_float>::length((vec<3U,_float> *)0x1f1811);
  fVar6 = vec<3U,_float>::length((vec<3U,_float> *)0x1f1825);
  if (fVar6 < fVar5) {
    utils::swap<crnlib::vec<3u,float>>((vec<3U,_float> *)pfVar4,r);
  }
  vec<6U,_float>::vec(in_RDI,&local_558);
  return in_RDI;
}

Assistant:

vec6F dxt_hc::palettize_color(color_quad_u8* pixels, uint pixels_count) {
  uint color[64];
  for (uint i = 0; i < pixels_count; i++)
    color[i] = pixels[i][0] << 16 | pixels[i][1] << 8 | pixels[i][2];
  std::sort(color, color + pixels_count);
  vec3F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || color[i] != color[i - 1]) {
      vectors[size][0] = m_params.m_perceptual ? m_uint8_to_float[color[i] >> 16] * 0.5f : m_uint8_to_float[color[i] >> 16];
      vectors[size][1] = m_uint8_to_float[color[i] >> 8 & 0xFF];
      vectors[size][2] = m_params.m_perceptual ? m_uint8_to_float[color[i] & 0xFF] * 0.25f : m_uint8_to_float[color[i] & 0xFF];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec3F result[2];
  split_vectors<vec3F>(vectors, weights, size, result);
  if (result[0].length() > result[1].length())
    utils::swap(result[0], result[1]);
  return *(vec6F*)result;
}